

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_CheckTerrain
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  sector_t_conflict *psVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  bool local_73;
  TAngle<double> local_70;
  TAngle<double> local_68;
  DAngle an;
  double speed;
  int anglespeed;
  FName local_44;
  sector_t *local_40;
  sector_t_conflict *sec;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1ab0,
                  "int AF_AActor_A_CheckTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    sec = (sector_t_conflict *)(param->field_0).field_1.a;
    local_73 = true;
    if (sec != (sector_t_conflict *)0x0) {
      local_73 = DObject::IsKindOf((DObject *)sec,AActor::RegistrationInfo.MyClass);
    }
    if (local_73 != false) {
      local_40 = *(sector_t **)&sec->validcount;
      dVar4 = AActor::Z((AActor *)sec);
      dVar5 = secplane_t::ZatPoint(&local_40->floorplane,(AActor *)sec);
      if (((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) &&
         (bVar3 = sector_t::PortalBlocksMovement(local_40,0), psVar1 = sec, bVar3)) {
        if (local_40->special == 0x73) {
          FName::FName(&local_44,NAME_InstantDeath);
          TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffb0,0.0);
          P_DamageMobj((AActor *)psVar1,(AActor *)0x0,(AActor *)0x0,999,&local_44,0,
                       (DAngle *)&stack0xffffffffffffffb0);
        }
        else if (local_40->special == 0x76) {
          iVar2 = FTagManager::GetFirstSectorTag(&tagManager,local_40);
          an.Degrees = (double)((iVar2 + -100) % 10) / 16.0;
          TAngle<double>::TAngle(&local_68,(double)((iVar2 + -100) / 10) * 45.0);
          psVar1 = sec;
          TAngle<double>::TAngle(&local_70,&local_68);
          AActor::Thrust((AActor *)psVar1,&local_70,an.Degrees);
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1ab0,
                  "int AF_AActor_A_CheckTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1ab0,
                "int AF_AActor_A_CheckTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckTerrain)
{
	PARAM_SELF_PROLOGUE(AActor);

	sector_t *sec = self->Sector;

	if (self->Z() == sec->floorplane.ZatPoint(self) && sec->PortalBlocksMovement(sector_t::floor))
	{
		if (sec->special == Damage_InstantDeath)
		{
			P_DamageMobj(self, NULL, NULL, 999, NAME_InstantDeath);
		}
		else if (sec->special == Scroll_StrifeCurrent)
		{
			int anglespeed = tagManager.GetFirstSectorTag(sec) - 100;
			double speed = (anglespeed % 10) / 16.;
			DAngle an = (anglespeed / 10) * (360 / 8.);
			self->Thrust(an, speed);
		}
	}
	return 0;
}